

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-terrain.cpp
# Opt level: O2

bool loadBackFramebufferTexture(void)

{
  GLboolean GVar1;
  GLenum GVar2;
  
  fwrite("Loading {Back-Framebuffer-Texture}\n",0x23,1,_stdout);
  fflush(_stdout);
  GVar1 = (*glad_glIsTexture)(g_gl.textures[0]);
  if (GVar1 != '\0') {
    (*glad_glDeleteTextures)(1,g_gl.textures);
  }
  (*glad_glGenTextures)(1,g_gl.textures);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,g_gl.textures[0]);
  (*glad_glTexStorage2D)(0xde1,1,0x8058,g_app.viewer.w,g_app.viewer.h);
  (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
  (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_glActiveTexture)(0x84c0);
  GVar2 = (*glad_glGetError)();
  return GVar2 == 0;
}

Assistant:

bool loadBackFramebufferTexture()
{
    LOG("Loading {Back-Framebuffer-Texture}\n");
    if (glIsTexture(g_gl.textures[TEXTURE_BACK]))
        glDeleteTextures(1, &g_gl.textures[TEXTURE_BACK]);
    glGenTextures(1, &g_gl.textures[TEXTURE_BACK]);

    glActiveTexture(GL_TEXTURE0 + TEXTURE_BACK);
    glBindTexture(GL_TEXTURE_2D, g_gl.textures[TEXTURE_BACK]);
    glTexStorage2D(GL_TEXTURE_2D,
        1,
        GL_RGBA8,
        g_app.viewer.w,
        g_app.viewer.h);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

    glActiveTexture(GL_TEXTURE0);

    return (glGetError() == GL_NO_ERROR);
}